

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

void __thiscall llbuild::basic::StringList::encode(StringList *this,BinaryEncoder *coder)

{
  StringRef bytes;
  size_t in_RCX;
  void *in_RDX;
  
  BinaryEncoder::write(coder,(int)this->size,in_RDX,in_RCX);
  bytes.Data = this->contents;
  bytes.Length = this->size;
  BinaryEncoder::writeBytes(coder,bytes);
  return;
}

Assistant:

void encode(BinaryEncoder& coder) const {
    coder.write(size);
    coder.writeBytes(StringRef(contents, size));
  }